

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddGroupMove(DdManager *table,int x,int y,Move **moves)

{
  Move *pMVar1;
  DdHalfWord x_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  DdNode *pDVar6;
  Move *pMVar7;
  DdHalfWord DVar8;
  DdHalfWord DVar9;
  int iVar10;
  int iVar11;
  DdHalfWord y_00;
  DdHalfWord x_01;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  
  uVar5 = table->subtables[x].next;
  iVar13 = x - uVar5;
  uVar4 = y;
  do {
    uVar3 = uVar4;
    uVar4 = table->subtables[(int)uVar3].next;
  } while (uVar3 < uVar4);
  iVar15 = uVar3 - y;
  iVar10 = 0;
  if (0 < iVar13 + 1) {
    iVar10 = iVar13 + 1;
  }
  DVar8 = 0xffffffff;
  iVar12 = -1;
  if (-1 < iVar15) {
    iVar12 = iVar15;
  }
  DVar9 = 0xffffffff;
  x_01 = y;
  for (iVar14 = 1; iVar11 = iVar10, iVar14 != iVar12 + 2; iVar14 = iVar14 + 1) {
    while (x_00 = x, y_00 = x_01, iVar11 != 0) {
      iVar2 = cuddSwapInPlace(table,x_00,y_00);
      if (iVar2 == 0) goto LAB_0074c9de;
      x = cuddNextLow(table,x_00);
      iVar11 = iVar11 + -1;
      x_01 = x_00;
      DVar9 = y_00;
      DVar8 = x_00;
    }
    x_01 = iVar14 + y;
    x = cuddNextLow(table,x_01);
  }
  uVar4 = uVar5;
  iVar10 = 0;
  if (0 < iVar15) {
    iVar10 = iVar15;
  }
  while( true ) {
    if (iVar10 == 0) break;
    uVar3 = cuddNextHigh(table,uVar4);
    table->subtables[(int)uVar4].next = uVar3;
    uVar4 = cuddNextHigh(table,uVar4);
    iVar10 = iVar10 + -1;
  }
  table->subtables[(int)uVar4].next = uVar5;
  uVar4 = cuddNextHigh(table,uVar4);
  uVar5 = uVar4;
  iVar10 = 0;
  if (0 < iVar13) {
    iVar10 = iVar13;
  }
  while( true ) {
    if (iVar10 == 0) break;
    uVar3 = cuddNextHigh(table,uVar5);
    table->subtables[(int)uVar5].next = uVar3;
    uVar5 = cuddNextHigh(table,uVar5);
    iVar10 = iVar10 + -1;
  }
  table->subtables[(int)uVar5].next = uVar4;
  pDVar6 = cuddDynamicAllocNode(table);
  if (pDVar6 == (DdNode *)0x0) {
LAB_0074c9de:
    pMVar7 = *moves;
    while (pMVar7 != (Move *)0x0) {
      pMVar1 = pMVar7->next;
      pMVar7->y = 0;
      *(DdNode **)&pMVar7->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar1;
      pMVar7 = pMVar1;
    }
    iVar13 = 0;
  }
  else {
    pDVar6->index = DVar8;
    pDVar6->ref = DVar9;
    *(undefined4 *)&pDVar6->next = 0;
    iVar13 = table->keys - table->isolated;
    *(int *)((long)&pDVar6->next + 4) = iVar13;
    (pDVar6->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar6;
  }
  return iVar13;
}

Assistant:

static int
ddGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size;
    int  i,j,xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    int  initialSize,bestSize;
#endif

#ifdef DD_DEBUG
    /* We assume that x < y */
    assert(x < y);
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    initialSize = bestSize = table->keys - table->isolated;
#endif
    /* Sift the variables of the second group up through the first group */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) goto ddGroupMoveOutOfMem;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
            if (size < bestSize)
                bestSize = size;
#endif
            swapx = x; swapy = y;
            y = x;
            x = cuddNextLow(table,y);
        }
        y = ytop + i;
        x = cuddNextLow(table,y);
    }
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if ((bestSize < initialSize) && (bestSize < size))
        (void) fprintf(table->out,"Missed local minimum: initialSize:%d  bestSize:%d  finalSize:%d\n",initialSize,bestSize,size);
#endif

    /* fix groups */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize - 1; i++) {
        table->subtables[y].next = cuddNextHigh(table,y);
        y = cuddNextHigh(table,y);
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                    /* it to top of its group */
    x = cuddNextHigh(table,y);
    newxtop = x;
    for (i = 0; i < xsize - 1; i++) {
        table->subtables[x].next = cuddNextHigh(table,x);
        x = cuddNextHigh(table,x);
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                    /* it to top of its group */
#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddGroupMove:\n");
#endif

    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) goto ddGroupMoveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->flags = MTR_DEFAULT;
    move->size = table->keys - table->isolated;
    move->next = *moves;
    *moves = move;

    return(table->keys - table->isolated);

ddGroupMoveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}